

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_portal.cpp
# Opt level: O0

void __thiscall GLSectorStackPortal::DrawContents(GLSectorStackPortal *this)

{
  int iVar1;
  FGLRenderer *this_00;
  byte *pbVar2;
  float vx;
  float vy;
  float vz;
  TVector2<double> local_38;
  subsector_t *local_28;
  subsector_t *sub;
  FPortal *local_18;
  FPortal *portal;
  GLSectorStackPortal *this_local;
  
  local_18 = this->origin;
  portal = (FPortal *)this;
  TVector3<double>::operator+=(&ViewPos,&this->origin->mDisplacement);
  GLRenderer->mViewActor = (AActor *)0x0;
  if (this->origin->plane != -1) {
    iVar1 = this->origin->plane;
    GLPortal::instack[iVar1] = GLPortal::instack[iVar1] + 1;
  }
  this_00 = GLRenderer;
  vx = (float)ViewPos.X;
  vy = (float)ViewPos.Y;
  vz = (float)ViewPos.Z;
  TAngle<double>::TAngle((TAngle<double> *)&sub,&ViewAngle);
  FGLRenderer::SetupView
            (this_00,vx,vy,vz,(DAngle *)&sub,(GLPortal::MirrorFlag & 1U) != 0,
             (GLPortal::PlaneMirrorFlag & 1U) != 0);
  GLPortal::SaveMapSection(&this->super_GLPortal);
  SetupCoverage(this);
  GLPortal::ClearClipper(&this->super_GLPortal);
  TVector2<double>::TVector2(&local_38,&ViewPos);
  local_28 = R_PointInSubsector(&local_38);
  pbVar2 = TArray<unsigned_char,_unsigned_char>::operator[]
                     (&gl_drawinfo->ss_renderflags,((long)local_28 - (long)subsectors) / 0x60);
  if ((*pbVar2 & 0x10) == 0) {
    Clipper::SafeAddClipRange(&clipper,0,0xffffffff);
    Clipper::SetBlocked(&clipper,true);
  }
  FGLRenderer::DrawScene(GLRenderer,2);
  GLPortal::RestoreMapSection(&this->super_GLPortal);
  if (this->origin->plane != -1) {
    iVar1 = this->origin->plane;
    GLPortal::instack[iVar1] = GLPortal::instack[iVar1] + -1;
  }
  return;
}

Assistant:

void GLSectorStackPortal::DrawContents()
{
	FPortal *portal = origin;

	ViewPos += origin->mDisplacement;
	GLRenderer->mViewActor = NULL;

	// avoid recursions!
	if (origin->plane != -1) instack[origin->plane]++;

	GLRenderer->SetupView(ViewPos.X, ViewPos.Y, ViewPos.Z, ViewAngle, !!(MirrorFlag&1), !!(PlaneMirrorFlag&1));
	SaveMapSection();
	SetupCoverage();
	ClearClipper();
	
	// If the viewpoint is not within the portal, we need to invalidate the entire clip area.
	// The portal will re-validate the necessary parts when its subsectors get traversed.
	subsector_t *sub = R_PointInSubsector(ViewPos);
	if (!(gl_drawinfo->ss_renderflags[sub - ::subsectors] & SSRF_SEEN))
	{
		clipper.SafeAddClipRange(0, ANGLE_MAX);
		clipper.SetBlocked(true);
	}

	GLRenderer->DrawScene(DM_PORTAL);
	RestoreMapSection();

	if (origin->plane != -1) instack[origin->plane]--;
}